

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O2

void GraphTask::initialize(search *sch,size_t *num_actions,options_i *options)

{
  unsigned_long *location;
  typed_option<unsigned_long> *ptVar1;
  option_group_definition *poVar2;
  ostream *poVar3;
  float *pfVar4;
  uint *puVar5;
  unsigned_long uVar6;
  size_t k;
  ulong uVar7;
  allocator local_690;
  allocator local_68f;
  allocator local_68e;
  allocator local_68d;
  allocator local_68c;
  allocator local_68b;
  allocator local_68a;
  allocator local_689;
  string local_688 [32];
  string local_668;
  string local_648 [32];
  string local_628;
  string local_608 [32];
  string local_5e8;
  string local_5c8 [32];
  string local_5a8;
  string local_588;
  option_group_definition new_options;
  undefined1 local_530 [160];
  undefined1 local_490 [160];
  undefined1 local_3f0 [160];
  typed_option<unsigned_long> local_350;
  typed_option<bool> local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<unsigned_long> local_d0;
  
  location = (unsigned_long *)operator_new(0xb8);
  memset(location,0,0xb8);
  std::__cxx11::string::string
            ((string *)&local_588,"search graphtask options",(allocator *)&local_350);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::string((string *)&local_5a8,"search_graph_num_loops",&local_689);
  VW::config::typed_option<unsigned_long>::typed_option(&local_350,&local_5a8,location);
  ptVar1 = VW::config::typed_option<unsigned_long>::default_value(&local_350,2);
  std::__cxx11::string::string(local_5c8,"how many loops to run [def: 2]",&local_68a);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,ptVar1);
  poVar2 = VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_d0);
  std::__cxx11::string::string((string *)&local_5e8,"search_graph_no_structure",&local_68b);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_5e8,(bool *)(location + 3));
  std::__cxx11::string::string(local_608,"turn off edge features",&local_68c);
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_3f0);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_170);
  std::__cxx11::string::string((string *)&local_628,"search_graph_separate_learners",&local_68d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_628,(bool *)((long)location + 0x19));
  std::__cxx11::string::string(local_648,"use a different learner for each pass",&local_68e);
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_490);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_210);
  std::__cxx11::string::string((string *)&local_668,"search_graph_directed",&local_68f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_668,(bool *)((long)location + 0x1a));
  std::__cxx11::string::string
            (local_688,"construct features based on directed graph semantics",&local_690);
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_530);
  VW::config::option_group_definition::add<bool>(poVar2,&local_2b0);
  VW::config::typed_option<bool>::~typed_option(&local_2b0);
  std::__cxx11::string::~string(local_688);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_530);
  std::__cxx11::string::~string((string *)&local_668);
  VW::config::typed_option<bool>::~typed_option(&local_210);
  std::__cxx11::string::~string(local_648);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_490);
  std::__cxx11::string::~string((string *)&local_628);
  VW::config::typed_option<bool>::~typed_option(&local_170);
  std::__cxx11::string::~string(local_608);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_3f0);
  std::__cxx11::string::~string((string *)&local_5e8);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_d0);
  std::__cxx11::string::~string(local_5c8);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_350);
  std::__cxx11::string::~string((string *)&local_5a8);
  (**options->_vptr_options_i)(options,&new_options);
  *(byte *)(location + 3) = (byte)location[3] ^ 1;
  if (*location < 2) {
    *location = 1;
    *(undefined1 *)((long)location + 0x19) = 0;
  }
  uVar6 = *num_actions;
  location[1] = uVar6;
  location[2] = (uVar6 + 1) * ((ulong)*(byte *)((long)location + 0x1a) + 1);
  poVar3 = std::operator<<((ostream *)&std::cerr,"K=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", numN=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  pfVar4 = calloc_or_throw<float>(location[2]);
  location[0x13] = (unsigned_long)pfVar4;
  puVar5 = calloc_or_throw<unsigned_int>((location[1] + 1) * (location[1] + 1));
  location[0x14] = (unsigned_long)puVar5;
  pfVar4 = calloc_or_throw<float>(location[1] + 1);
  location[0x15] = (unsigned_long)pfVar4;
  uVar6 = location[1];
  *(float *)(location + 0x16) = (float)(uVar6 + 1);
  for (uVar7 = 0; uVar7 <= uVar6; uVar7 = uVar7 + 1) {
    *(undefined4 *)(location[0x15] + uVar7 * 4) = 0x3f800000;
    uVar6 = location[1];
  }
  if (*(bool *)((long)location + 0x19) != false) {
    Search::search::set_num_learners(sch,*location);
  }
  sch->task_data = location;
  Search::search::set_options(sch,0);
  Search::search::set_label_parser(sch,(label_parser *)&COST_SENSITIVE::cs_label,example_is_test);
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& options)
{
  task_data* D = new task_data();

  option_group_definition new_options("search graphtask options");
  new_options
      .add(make_option("search_graph_num_loops", D->num_loops).default_value(2).help("how many loops to run [def: 2]"))
      .add(make_option("search_graph_no_structure", D->use_structure).help("turn off edge features"))
      .add(make_option("search_graph_separate_learners", D->separate_learners)
               .help("use a different learner for each pass"))
      .add(make_option("search_graph_directed", D->directed)
               .help("construct features based on directed graph semantics"));
  options.add_and_parse(new_options);

  D->use_structure = !D->use_structure;

  if (D->num_loops <= 1)
  {
    D->num_loops = 1;
    D->separate_learners = false;
  }

  D->K = num_actions;
  D->numN = (D->directed + 1) * (D->K + 1);
  cerr << "K=" << D->K << ", numN=" << D->numN << endl;
  D->neighbor_predictions = calloc_or_throw<float>(D->numN);

  D->confusion_matrix = calloc_or_throw<uint32_t>((D->K + 1) * (D->K + 1));
  D->true_counts = calloc_or_throw<float>(D->K + 1);
  D->true_counts_total = (float)(D->K + 1);
  for (size_t k = 0; k <= D->K; k++) D->true_counts[k] = 1.;

  if (D->separate_learners)
    sch.set_num_learners(D->num_loops);

  sch.set_task_data<task_data>(D);
  sch.set_options(0);  // Search::AUTO_HAMMING_LOSS
  sch.set_label_parser(COST_SENSITIVE::cs_label, example_is_test);
}